

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc_global.h
# Opt level: O3

abctime Abc_Clock(void)

{
  int iVar1;
  abctime aVar2;
  timespec ts;
  timespec local_10;
  
  iVar1 = clock_gettime(3,&local_10);
  if (iVar1 < 0) {
    aVar2 = -1;
  }
  else {
    aVar2 = local_10.tv_nsec / 1000 + local_10.tv_sec * 1000000;
  }
  return aVar2;
}

Assistant:

static inline abctime Abc_Clock()
{
#if (defined(LIN) || defined(LIN64)) && !(__APPLE__ & __MACH__) && !defined(__MINGW32__)
    struct timespec ts;
    if ( clock_gettime(CLOCK_THREAD_CPUTIME_ID, &ts) < 0 ) 
        return (abctime)-1;
    abctime res = ((abctime) ts.tv_sec) * CLOCKS_PER_SEC;
    res += (((abctime) ts.tv_nsec) * CLOCKS_PER_SEC) / 1000000000;
    return res;
#else
    return (abctime) clock();
#endif
}